

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  float *pfVar1;
  range<unsigned_int> rVar2;
  RTCFormat RVar3;
  InstanceArray *pIVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char cVar30;
  Accel *pAVar31;
  runtime_error *prVar32;
  long lVar33;
  ulong uVar34;
  size_t i;
  ulong uVar35;
  vfloat4 lower;
  undefined1 in_XMM1 [16];
  vfloat4 upper;
  undefined1 auVar36 [16];
  float fVar37;
  uint uVar38;
  uint uVar45;
  uint uVar46;
  undefined1 in_XMM2 [16];
  undefined1 auVar39 [16];
  float fVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar54;
  float fVar55;
  undefined1 auVar49 [16];
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  float in_XMM11_Da;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  task_group_context *in_stack_fffffffffffffde8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_128 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  anon_class_8_1_898bcfc2 local_110;
  blocked_range<unsigned_int> local_108;
  MortonCodeMapping mapping;
  BBox3fa centBounds;
  task_group_context context;
  
  uVar38 = current->_begin;
  uVar35 = (ulong)uVar38;
  uVar45 = current->_end;
  if (uVar45 - uVar38 < 0x400) {
    _local_1b8 = _DAT_01f45a30;
    auVar49 = _DAT_01f45a30;
    auVar59 = _DAT_01f45a40;
    for (; uVar35 < uVar45; uVar35 = uVar35 + 1) {
      pIVar4 = this->calculateBounds->mesh;
      uVar34 = (ulong)this->morton[uVar35].field_0.field_0.index;
      if ((*(long *)&(pIVar4->super_Geometry).field_0x58 != 0) ||
         (*(int *)((pIVar4->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar4->object_ids).super_RawBufferView.stride * uVar34) != -1)) {
        pRVar5 = (pIVar4->l2w_buf).items;
        RVar3 = pRVar5->format;
        if ((pIVar4->super_Geometry).field_8.field_0x1 == '\x01') {
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            fStack_164 = *(float *)(pcVar6 + lVar33 + 0x10);
            local_168 = *(float *)(pcVar6 + lVar33);
            local_1a8 = *(float *)(pcVar6 + lVar33 + 4);
            local_178 = *(float *)(pcVar6 + lVar33 + 8);
            local_188 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_160 = *(float *)(pcVar6 + lVar33 + 0x20);
            fStack_15c = 0.0;
            fStack_1a4 = *(float *)(pcVar6 + lVar33 + 0x14);
            fStack_1a0 = *(float *)(pcVar6 + lVar33 + 0x24);
            fStack_19c = 0.0;
            fStack_174 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_170 = *(float *)(pcVar6 + lVar33 + 0x28);
            fStack_16c = 0.0;
            fStack_184 = *(float *)(pcVar6 + lVar33 + 0x1c);
            fStack_180 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fStack_17c = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            local_168 = *(float *)(pcVar6 + lVar33);
            fStack_164 = (float)*(undefined8 *)(pcVar6 + lVar33 + 4);
            fStack_160 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 4) >> 0x20);
            fStack_15c = 0.0;
            local_1a8 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_1a4 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            fStack_19c = 0.0;
            local_178 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_174 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            fStack_170 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fStack_16c = 0.0;
            local_188 = *(float *)(pcVar6 + lVar33 + 0x24);
            fStack_184 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x28);
            fStack_180 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x28) >> 0x20);
            fStack_17c = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            local_178 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            fStack_174 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            local_168 = *(float *)(pcVar6 + lVar33);
            fStack_1a4 = *(float *)(pcVar6 + lVar33 + 4);
            fStack_170 = *(float *)(pcVar6 + lVar33 + 8);
            local_1a8 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_164 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x34);
            fStack_160 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x34) >> 0x20);
            local_188 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_184 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            fStack_180 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fVar47 = *(float *)(pcVar6 + lVar33 + 0x24);
            fVar37 = *(float *)(pcVar6 + lVar33 + 0x28);
            fVar90 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fVar69 = *(float *)(pcVar6 + lVar33 + 0x30);
            fVar65 = fVar69 * fVar69 + fVar90 * fVar90 + fVar47 * fVar47 + fVar37 * fVar37;
            auVar49 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
            fVar48 = auVar49._0_4_;
            fVar48 = fVar48 * fVar48 * fVar65 * -0.5 * fVar48 + fVar48 * 1.5;
            fStack_17c = fVar47 * fVar48;
            fStack_15c = fVar37 * fVar48;
            fStack_19c = fVar90 * fVar48;
            fStack_16c = fVar48 * fVar69;
            fStack_1a0 = *(float *)(pcVar6 + lVar33 + 0x3c);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            pfVar1 = (float *)(pcVar6 + lVar33);
            local_168 = *pfVar1;
            fStack_164 = pfVar1[1];
            fStack_160 = pfVar1[2];
            fStack_15c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x10);
            local_1a8 = *pfVar1;
            fStack_1a4 = pfVar1[1];
            fStack_1a0 = pfVar1[2];
            fStack_19c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x20);
            local_178 = *pfVar1;
            fStack_174 = pfVar1[1];
            fStack_170 = pfVar1[2];
            fStack_16c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x30);
            local_188 = *pfVar1;
            fStack_184 = pfVar1[1];
            fStack_180 = pfVar1[2];
            fStack_17c = pfVar1[3];
          }
          fVar90 = fStack_15c * fStack_19c + fStack_16c * fStack_17c;
          fVar47 = fStack_15c * fStack_19c - fStack_16c * fStack_17c;
          fVar37 = fStack_17c * fStack_17c + fStack_15c * fStack_15c + -fStack_19c * fStack_19c +
                   -fStack_16c * fStack_16c;
          fVar48 = fStack_17c * fStack_17c - fStack_15c * fStack_15c;
          fVar54 = fStack_19c * fStack_19c + fVar48 + -fStack_16c * fStack_16c;
          fVar64 = fStack_15c * fStack_16c - fStack_19c * fStack_17c;
          fVar69 = fStack_19c * fStack_17c + fStack_15c * fStack_16c;
          fVar57 = fStack_19c * fStack_16c + fStack_15c * fStack_17c;
          fVar65 = fStack_19c * fStack_16c - fStack_15c * fStack_17c;
          fVar55 = fStack_16c * fStack_16c + fVar48 + -fStack_19c * fStack_19c;
          fVar90 = fVar90 + fVar90;
          fVar64 = fVar64 + fVar64;
          fVar47 = fVar47 + fVar47;
          fVar57 = fVar57 + fVar57;
          fVar69 = fVar69 + fVar69;
          fVar65 = fVar65 + fVar65;
          fVar56 = fVar37 * 1.0 + fVar90 * 0.0 + fVar64 * 0.0;
          fVar63 = fVar37 * 0.0 + fVar90 * 1.0 + fVar64 * 0.0;
          fVar66 = fVar37 * 0.0 + fVar90 * 0.0 + fVar64 * 1.0;
          fVar68 = fVar37 * 0.0 + fVar90 * 0.0 + fVar64 * 0.0;
          fVar37 = fVar47 * 1.0 + fVar54 * 0.0 + fVar57 * 0.0;
          fVar90 = fVar47 * 0.0 + fVar54 * 1.0 + fVar57 * 0.0;
          fVar48 = fVar47 * 0.0 + fVar54 * 0.0 + fVar57 * 1.0;
          fVar54 = fVar47 * 0.0 + fVar54 * 0.0 + fVar57 * 0.0;
          fVar70 = fVar69 * 1.0 + fVar65 * 0.0 + fVar55 * 0.0;
          fVar72 = fVar69 * 0.0 + fVar65 * 1.0 + fVar55 * 0.0;
          fVar74 = fVar69 * 0.0 + fVar65 * 0.0 + fVar55 * 1.0;
          fVar76 = fVar69 * 0.0 + fVar65 * 0.0 + fVar55 * 0.0;
          fVar57 = local_168 * fVar56 + fVar37 * 0.0 + fVar70 * 0.0;
          fVar64 = local_168 * fVar63 + fVar90 * 0.0 + fVar72 * 0.0;
          fVar67 = local_168 * fVar66 + fVar48 * 0.0 + fVar74 * 0.0;
          fVar100 = local_168 * fVar68 + fVar54 * 0.0 + fVar76 * 0.0;
          fVar47 = local_1a8 * fVar56 + fStack_1a4 * fVar37 + fVar70 * 0.0;
          fVar69 = local_1a8 * fVar63 + fStack_1a4 * fVar90 + fVar72 * 0.0;
          fVar65 = local_1a8 * fVar66 + fStack_1a4 * fVar48 + fVar74 * 0.0;
          fVar55 = local_1a8 * fVar68 + fStack_1a4 * fVar54 + fVar76 * 0.0;
          fVar94 = local_178 * fVar56 + fStack_174 * fVar37 + fStack_170 * fVar70;
          fVar95 = local_178 * fVar63 + fStack_174 * fVar90 + fStack_170 * fVar72;
          fVar96 = local_178 * fVar66 + fStack_174 * fVar48 + fStack_170 * fVar74;
          fVar98 = local_178 * fVar68 + fStack_174 * fVar54 + fStack_170 * fVar76;
          fVar37 = local_188 * fVar56 + fStack_184 * fVar37 + fStack_180 * fVar70 + fStack_164 + 0.0
          ;
          fVar90 = local_188 * fVar63 + fStack_184 * fVar90 + fStack_180 * fVar72 + fStack_160 + 0.0
          ;
          fVar48 = local_188 * fVar66 + fStack_184 * fVar48 + fStack_180 * fVar74 + fStack_1a0 + 0.0
          ;
          fVar54 = local_188 * fVar68 + fStack_184 * fVar54 + fStack_180 * fVar76 + 0.0;
          pAVar31 = InstanceArray::getObject(pIVar4,uVar34);
          auVar49 = minps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar39 = maxps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar68 = auVar49._0_4_;
          fVar72 = auVar49._4_4_;
          fVar56 = auVar49._8_4_;
          fVar70 = fVar56 * fVar94 + fVar37;
          fVar74 = fVar56 * fVar95 + fVar90;
          fVar76 = fVar56 * fVar96 + fVar48;
          fVar86 = fVar56 * fVar98 + fVar54;
          fVar87 = fVar72 * fVar47;
          fVar88 = fVar72 * fVar69;
          fVar89 = fVar72 * fVar65;
          fVar72 = fVar72 * fVar55;
          fVar71 = fVar87 + fVar70;
          fVar73 = fVar88 + fVar74;
          fVar75 = fVar89 + fVar76;
          fVar77 = fVar72 + fVar86;
          fVar91 = fVar68 * fVar57;
          fVar92 = fVar68 * fVar64;
          fVar93 = fVar68 * fVar67;
          fVar68 = fVar68 * fVar100;
          auVar80._0_4_ = fVar91 + fVar71;
          auVar80._4_4_ = fVar92 + fVar73;
          auVar80._8_4_ = fVar93 + fVar75;
          auVar80._12_4_ = fVar68 + fVar77;
          auVar49 = minps(_DAT_01f45a30,auVar80);
          auVar36 = maxps(_DAT_01f45a40,auVar80);
          fVar56 = auVar39._0_4_;
          fVar63 = auVar39._4_4_;
          fVar66 = auVar39._8_4_;
          fVar37 = fVar66 * fVar94 + fVar37;
          fVar90 = fVar66 * fVar95 + fVar90;
          fVar48 = fVar66 * fVar96 + fVar48;
          fVar54 = fVar66 * fVar98 + fVar54;
          fVar87 = fVar87 + fVar37;
          fVar88 = fVar88 + fVar90;
          fVar89 = fVar89 + fVar48;
          fVar72 = fVar72 + fVar54;
          auVar81._0_4_ = fVar91 + fVar87;
          auVar81._4_4_ = fVar92 + fVar88;
          auVar81._8_4_ = fVar93 + fVar89;
          auVar81._12_4_ = fVar68 + fVar72;
          auVar49 = minps(auVar49,auVar81);
          auVar36 = maxps(auVar36,auVar81);
          fVar47 = fVar63 * fVar47;
          fVar69 = fVar63 * fVar69;
          fVar65 = fVar63 * fVar65;
          fVar63 = fVar63 * fVar55;
          fVar70 = fVar70 + fVar47;
          fVar74 = fVar74 + fVar69;
          fVar76 = fVar76 + fVar65;
          fVar86 = fVar86 + fVar63;
          fVar55 = fVar91 + fVar70;
          fVar66 = fVar92 + fVar74;
          fVar94 = fVar93 + fVar76;
          fVar95 = fVar68 + fVar86;
          auVar24._4_4_ = fVar66;
          auVar24._0_4_ = fVar55;
          auVar24._8_4_ = fVar94;
          auVar24._12_4_ = fVar95;
          auVar49 = minps(auVar49,auVar24);
          auVar25._4_4_ = fVar66;
          auVar25._0_4_ = fVar55;
          auVar25._8_4_ = fVar94;
          auVar25._12_4_ = fVar95;
          auVar36 = maxps(auVar36,auVar25);
          fVar47 = fVar47 + fVar37;
          fVar69 = fVar69 + fVar90;
          fVar65 = fVar65 + fVar48;
          fVar63 = fVar63 + fVar54;
          fVar91 = fVar91 + fVar47;
          fVar92 = fVar92 + fVar69;
          fVar93 = fVar93 + fVar65;
          fVar68 = fVar68 + fVar63;
          auVar9._4_4_ = fVar92;
          auVar9._0_4_ = fVar91;
          auVar9._8_4_ = fVar93;
          auVar9._12_4_ = fVar68;
          auVar49 = minps(auVar49,auVar9);
          auVar10._4_4_ = fVar92;
          auVar10._0_4_ = fVar91;
          auVar10._8_4_ = fVar93;
          auVar10._12_4_ = fVar68;
          auVar36 = maxps(auVar36,auVar10);
          fVar57 = fVar56 * fVar57;
          fVar64 = fVar56 * fVar64;
          fVar67 = fVar56 * fVar67;
          fVar56 = fVar56 * fVar100;
          fVar71 = fVar71 + fVar57;
          fVar73 = fVar73 + fVar64;
          fVar75 = fVar75 + fVar67;
          fVar77 = fVar77 + fVar56;
          auVar16._4_4_ = fVar73;
          auVar16._0_4_ = fVar71;
          auVar16._8_4_ = fVar75;
          auVar16._12_4_ = fVar77;
          auVar49 = minps(auVar49,auVar16);
          auVar17._4_4_ = fVar73;
          auVar17._0_4_ = fVar71;
          auVar17._8_4_ = fVar75;
          auVar17._12_4_ = fVar77;
          auVar36 = maxps(auVar36,auVar17);
          auVar60._0_4_ = fVar87 + fVar57;
          auVar60._4_4_ = fVar88 + fVar64;
          auVar60._8_4_ = fVar89 + fVar67;
          auVar60._12_4_ = fVar72 + fVar56;
          auVar49 = minps(auVar49,auVar60);
          auVar36 = maxps(auVar36,auVar60);
          auVar51._0_4_ = fVar70 + fVar57;
          auVar51._4_4_ = fVar74 + fVar64;
          auVar51._8_4_ = fVar76 + fVar67;
          auVar51._12_4_ = fVar86 + fVar56;
          auVar49 = minps(auVar49,auVar51);
          auVar36 = maxps(auVar36,auVar51);
          auVar42._0_4_ = fVar57 + fVar47;
          auVar42._4_4_ = fVar64 + fVar69;
          auVar42._8_4_ = fVar67 + fVar65;
          auVar42._12_4_ = fVar56 + fVar63;
          auVar49 = minps(auVar49,auVar42);
          in_XMM1 = maxps(auVar36,auVar42);
        }
        else {
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM10_Db = *(float *)(pcVar6 + lVar33 + 0x10);
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 4);
            in_XMM12_Da = *(float *)(pcVar6 + lVar33 + 8);
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM10_Dc = *(float *)(pcVar6 + lVar33 + 0x20);
            in_XMM10_Dd = 0.0;
            in_XMM11_Db = *(float *)(pcVar6 + lVar33 + 0x14);
            in_XMM11_Dc = *(float *)(pcVar6 + lVar33 + 0x24);
            in_XMM11_Dd = 0.0;
            in_XMM12_Db = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM12_Dc = *(float *)(pcVar6 + lVar33 + 0x28);
            in_XMM12_Dd = 0.0;
            in_XMM13_Db = *(float *)(pcVar6 + lVar33 + 0x1c);
            in_XMM13_Dc = *(float *)(pcVar6 + lVar33 + 0x2c);
            in_XMM13_Dd = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 4);
            in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 4) >> 0x20);
            in_XMM10_Dd = 0.0;
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            in_XMM11_Dd = 0.0;
            in_XMM12_Da = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM12_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            in_XMM12_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            in_XMM12_Dd = 0.0;
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0x24);
            in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x28);
            in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x28) >> 0x20);
            in_XMM13_Dd = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM12_Da = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            in_XMM12_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM11_Db = *(float *)(pcVar6 + lVar33 + 4);
            in_XMM12_Dc = *(float *)(pcVar6 + lVar33 + 8);
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x34);
            in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x34) >> 0x20);
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fVar47 = *(float *)(pcVar6 + lVar33 + 0x24);
            fVar37 = *(float *)(pcVar6 + lVar33 + 0x28);
            fVar90 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fVar69 = *(float *)(pcVar6 + lVar33 + 0x30);
            fVar65 = fVar69 * fVar69 + fVar90 * fVar90 + fVar47 * fVar47 + fVar37 * fVar37;
            auVar49 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
            fVar48 = auVar49._0_4_;
            fVar48 = fVar48 * fVar48 * fVar65 * -0.5 * fVar48 + fVar48 * 1.5;
            in_XMM13_Dd = fVar47 * fVar48;
            in_XMM10_Dd = fVar37 * fVar48;
            in_XMM11_Dd = fVar90 * fVar48;
            in_XMM12_Dd = fVar48 * fVar69;
            in_XMM11_Dc = *(float *)(pcVar6 + lVar33 + 0x3c);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            pfVar1 = (float *)(pcVar6 + lVar33);
            in_XMM10_Da = *pfVar1;
            in_XMM10_Db = pfVar1[1];
            in_XMM10_Dc = pfVar1[2];
            in_XMM10_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x10);
            in_XMM11_Da = *pfVar1;
            in_XMM11_Db = pfVar1[1];
            in_XMM11_Dc = pfVar1[2];
            in_XMM11_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x20);
            in_XMM12_Da = *pfVar1;
            in_XMM12_Db = pfVar1[1];
            in_XMM12_Dc = pfVar1[2];
            in_XMM12_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x30);
            in_XMM13_Da = *pfVar1;
            in_XMM13_Db = pfVar1[1];
            in_XMM13_Dc = pfVar1[2];
            in_XMM13_Dd = pfVar1[3];
          }
          pAVar31 = InstanceArray::getObject(pIVar4,uVar34);
          auVar49 = minps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar39 = maxps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar69 = auVar49._0_4_;
          fVar65 = auVar49._4_4_;
          fVar47 = auVar49._8_4_;
          fVar48 = fVar47 * in_XMM12_Da + in_XMM13_Da;
          fVar54 = fVar47 * in_XMM12_Db + in_XMM13_Db;
          fVar55 = fVar47 * in_XMM12_Dc + in_XMM13_Dc;
          fVar56 = fVar47 * in_XMM12_Dd + in_XMM13_Dd;
          fVar70 = fVar65 * in_XMM11_Da + fVar48;
          fVar72 = fVar65 * in_XMM11_Db + fVar54;
          fVar74 = fVar65 * in_XMM11_Dc + fVar55;
          fVar76 = fVar65 * in_XMM11_Dd + fVar56;
          fVar66 = fVar69 * in_XMM10_Da;
          fVar67 = fVar69 * in_XMM10_Db;
          fVar68 = fVar69 * in_XMM10_Dc;
          fVar69 = fVar69 * in_XMM10_Dd;
          auVar78._0_4_ = fVar66 + fVar70;
          auVar78._4_4_ = fVar67 + fVar72;
          auVar78._8_4_ = fVar68 + fVar74;
          auVar78._12_4_ = fVar69 + fVar76;
          auVar49 = minps(_DAT_01f45a30,auVar78);
          auVar36 = maxps(_DAT_01f45a40,auVar78);
          fVar47 = auVar39._0_4_;
          fVar37 = auVar39._4_4_;
          fVar90 = auVar39._8_4_;
          fVar86 = fVar90 * in_XMM12_Da + in_XMM13_Da;
          fVar87 = fVar90 * in_XMM12_Db + in_XMM13_Db;
          fVar88 = fVar90 * in_XMM12_Dc + in_XMM13_Dc;
          fVar89 = fVar90 * in_XMM12_Dd + in_XMM13_Dd;
          fVar57 = fVar65 * in_XMM11_Da + fVar86;
          fVar63 = fVar65 * in_XMM11_Db + fVar87;
          fVar64 = fVar65 * in_XMM11_Dc + fVar88;
          fVar65 = fVar65 * in_XMM11_Dd + fVar89;
          auVar79._0_4_ = fVar66 + fVar57;
          auVar79._4_4_ = fVar67 + fVar63;
          auVar79._8_4_ = fVar68 + fVar64;
          auVar79._12_4_ = fVar69 + fVar65;
          auVar49 = minps(auVar49,auVar79);
          auVar36 = maxps(auVar36,auVar79);
          fVar48 = fVar48 + fVar37 * in_XMM11_Da;
          fVar54 = fVar54 + fVar37 * in_XMM11_Db;
          fVar55 = fVar55 + fVar37 * in_XMM11_Dc;
          fVar56 = fVar56 + fVar37 * in_XMM11_Dd;
          fVar90 = fVar66 + fVar48;
          fVar91 = fVar67 + fVar54;
          fVar92 = fVar68 + fVar55;
          fVar93 = fVar69 + fVar56;
          auVar22._4_4_ = fVar91;
          auVar22._0_4_ = fVar90;
          auVar22._8_4_ = fVar92;
          auVar22._12_4_ = fVar93;
          auVar49 = minps(auVar49,auVar22);
          auVar23._4_4_ = fVar91;
          auVar23._0_4_ = fVar90;
          auVar23._8_4_ = fVar92;
          auVar23._12_4_ = fVar93;
          auVar36 = maxps(auVar36,auVar23);
          fVar86 = fVar37 * in_XMM11_Da + fVar86;
          fVar87 = fVar37 * in_XMM11_Db + fVar87;
          fVar88 = fVar37 * in_XMM11_Dc + fVar88;
          fVar89 = fVar37 * in_XMM11_Dd + fVar89;
          fVar66 = fVar66 + fVar86;
          fVar67 = fVar67 + fVar87;
          fVar68 = fVar68 + fVar88;
          fVar69 = fVar69 + fVar89;
          auVar7._4_4_ = fVar67;
          auVar7._0_4_ = fVar66;
          auVar7._8_4_ = fVar68;
          auVar7._12_4_ = fVar69;
          auVar49 = minps(auVar49,auVar7);
          auVar8._4_4_ = fVar67;
          auVar8._0_4_ = fVar66;
          auVar8._8_4_ = fVar68;
          auVar8._12_4_ = fVar69;
          auVar36 = maxps(auVar36,auVar8);
          fVar37 = fVar47 * in_XMM10_Da;
          fVar90 = fVar47 * in_XMM10_Db;
          fVar69 = fVar47 * in_XMM10_Dc;
          fVar47 = fVar47 * in_XMM10_Dd;
          fVar70 = fVar70 + fVar37;
          fVar72 = fVar72 + fVar90;
          fVar74 = fVar74 + fVar69;
          fVar76 = fVar76 + fVar47;
          auVar14._4_4_ = fVar72;
          auVar14._0_4_ = fVar70;
          auVar14._8_4_ = fVar74;
          auVar14._12_4_ = fVar76;
          auVar49 = minps(auVar49,auVar14);
          auVar15._4_4_ = fVar72;
          auVar15._0_4_ = fVar70;
          auVar15._8_4_ = fVar74;
          auVar15._12_4_ = fVar76;
          auVar36 = maxps(auVar36,auVar15);
          auVar58._0_4_ = fVar57 + fVar37;
          auVar58._4_4_ = fVar63 + fVar90;
          auVar58._8_4_ = fVar64 + fVar69;
          auVar58._12_4_ = fVar65 + fVar47;
          auVar49 = minps(auVar49,auVar58);
          auVar36 = maxps(auVar36,auVar58);
          auVar50._0_4_ = fVar48 + fVar37;
          auVar50._4_4_ = fVar54 + fVar90;
          auVar50._8_4_ = fVar55 + fVar69;
          auVar50._12_4_ = fVar56 + fVar47;
          auVar49 = minps(auVar49,auVar50);
          auVar36 = maxps(auVar36,auVar50);
          auVar40._0_4_ = fVar37 + fVar86;
          auVar40._4_4_ = fVar90 + fVar87;
          auVar40._8_4_ = fVar69 + fVar88;
          auVar40._12_4_ = fVar47 + fVar89;
          auVar49 = minps(auVar49,auVar40);
          in_XMM1 = maxps(auVar36,auVar40);
        }
      }
      auVar41._0_4_ = in_XMM1._0_4_ + auVar49._0_4_;
      auVar41._4_4_ = in_XMM1._4_4_ + auVar49._4_4_;
      auVar41._8_4_ = in_XMM1._8_4_ + auVar49._8_4_;
      auVar41._12_4_ = in_XMM1._12_4_ + auVar49._12_4_;
      _local_1b8 = minps(_local_1b8,auVar41);
      auVar59 = maxps(auVar59,auVar41);
      uVar45 = current->_end;
    }
    auVar36._0_4_ = auVar59._0_4_ - (float)local_1b8._0_4_;
    auVar36._4_4_ = auVar59._4_4_ - (float)local_1b8._4_4_;
    auVar36._8_4_ = auVar59._8_4_ - fStack_1b0;
    auVar36._12_4_ = auVar59._12_4_ - fStack_1ac;
    auVar59._4_4_ = -(uint)(1e-19 < auVar36._4_4_);
    auVar59._0_4_ = -(uint)(1e-19 < auVar36._0_4_);
    auVar59._8_4_ = -(uint)(1e-19 < auVar36._8_4_);
    auVar59._12_4_ = -(uint)(1e-19 < auVar36._12_4_);
    auVar49 = rcpps(in_XMM1,auVar36);
    fVar47 = auVar49._0_4_;
    fVar37 = auVar49._4_4_;
    fVar90 = auVar49._8_4_;
    for (uVar35 = (ulong)current->_begin; uVar35 < uVar45; uVar35 = uVar35 + 1) {
      pIVar4 = this->calculateBounds->mesh;
      uVar34 = (ulong)this->morton[uVar35].field_0.field_0.index;
      if ((*(long *)&(pIVar4->super_Geometry).field_0x58 != 0) ||
         (*(int *)((pIVar4->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar4->object_ids).super_RawBufferView.stride * uVar34) != -1)) {
        pRVar5 = (pIVar4->l2w_buf).items;
        RVar3 = pRVar5->format;
        if ((pIVar4->super_Geometry).field_8.field_0x1 == '\x01') {
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            fStack_164 = *(float *)(pcVar6 + lVar33 + 0x10);
            local_168 = *(float *)(pcVar6 + lVar33);
            local_1a8 = *(float *)(pcVar6 + lVar33 + 4);
            local_178 = *(float *)(pcVar6 + lVar33 + 8);
            local_188 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_160 = *(float *)(pcVar6 + lVar33 + 0x20);
            fStack_15c = 0.0;
            fStack_1a4 = *(float *)(pcVar6 + lVar33 + 0x14);
            fStack_1a0 = *(float *)(pcVar6 + lVar33 + 0x24);
            fStack_19c = 0.0;
            fStack_174 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_170 = *(float *)(pcVar6 + lVar33 + 0x28);
            fStack_16c = 0.0;
            fStack_184 = *(float *)(pcVar6 + lVar33 + 0x1c);
            fStack_180 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fStack_17c = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            local_168 = *(float *)(pcVar6 + lVar33);
            fStack_164 = (float)*(undefined8 *)(pcVar6 + lVar33 + 4);
            fStack_160 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 4) >> 0x20);
            fStack_15c = 0.0;
            local_1a8 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_1a4 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            fStack_19c = 0.0;
            local_178 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_174 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            fStack_170 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fStack_16c = 0.0;
            local_188 = *(float *)(pcVar6 + lVar33 + 0x24);
            fStack_184 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x28);
            fStack_180 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x28) >> 0x20);
            fStack_17c = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            local_178 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            fStack_174 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            local_168 = *(float *)(pcVar6 + lVar33);
            fStack_1a4 = *(float *)(pcVar6 + lVar33 + 4);
            fStack_170 = *(float *)(pcVar6 + lVar33 + 8);
            local_1a8 = *(float *)(pcVar6 + lVar33 + 0xc);
            fStack_164 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x34);
            fStack_160 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x34) >> 0x20);
            local_188 = *(float *)(pcVar6 + lVar33 + 0x18);
            fStack_184 = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            fStack_180 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fVar69 = *(float *)(pcVar6 + lVar33 + 0x24);
            fVar48 = *(float *)(pcVar6 + lVar33 + 0x28);
            fVar65 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fVar54 = *(float *)(pcVar6 + lVar33 + 0x30);
            fVar56 = fVar54 * fVar54 + fVar65 * fVar65 + fVar69 * fVar69 + fVar48 * fVar48;
            auVar49 = rsqrtss(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
            fVar55 = auVar49._0_4_;
            fVar55 = fVar55 * fVar55 * fVar56 * -0.5 * fVar55 + fVar55 * 1.5;
            fStack_17c = fVar69 * fVar55;
            fStack_15c = fVar48 * fVar55;
            fStack_19c = fVar65 * fVar55;
            fStack_16c = fVar55 * fVar54;
            fStack_1a0 = *(float *)(pcVar6 + lVar33 + 0x3c);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            pfVar1 = (float *)(pcVar6 + lVar33);
            local_168 = *pfVar1;
            fStack_164 = pfVar1[1];
            fStack_160 = pfVar1[2];
            fStack_15c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x10);
            local_1a8 = *pfVar1;
            fStack_1a4 = pfVar1[1];
            fStack_1a0 = pfVar1[2];
            fStack_19c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x20);
            local_178 = *pfVar1;
            fStack_174 = pfVar1[1];
            fStack_170 = pfVar1[2];
            fStack_16c = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x30);
            local_188 = *pfVar1;
            fStack_184 = pfVar1[1];
            fStack_180 = pfVar1[2];
            fStack_17c = pfVar1[3];
          }
          fVar65 = fStack_15c * fStack_19c + fStack_16c * fStack_17c;
          fVar69 = fStack_15c * fStack_19c - fStack_16c * fStack_17c;
          fVar48 = fStack_17c * fStack_17c + fStack_15c * fStack_15c + -fStack_19c * fStack_19c +
                   -fStack_16c * fStack_16c;
          fVar55 = fStack_17c * fStack_17c - fStack_15c * fStack_15c;
          fVar57 = fStack_19c * fStack_19c + fVar55 + -fStack_16c * fStack_16c;
          fVar68 = fStack_15c * fStack_16c - fStack_19c * fStack_17c;
          fVar54 = fStack_19c * fStack_17c + fStack_15c * fStack_16c;
          fVar66 = fStack_19c * fStack_16c + fStack_15c * fStack_17c;
          fVar56 = fStack_19c * fStack_16c - fStack_15c * fStack_17c;
          fVar63 = fStack_16c * fStack_16c + fVar55 + -fStack_19c * fStack_19c;
          fVar65 = fVar65 + fVar65;
          fVar68 = fVar68 + fVar68;
          fVar69 = fVar69 + fVar69;
          fVar66 = fVar66 + fVar66;
          fVar54 = fVar54 + fVar54;
          fVar56 = fVar56 + fVar56;
          fVar64 = fVar48 * 1.0 + fVar65 * 0.0 + fVar68 * 0.0;
          fVar67 = fVar48 * 0.0 + fVar65 * 1.0 + fVar68 * 0.0;
          fVar70 = fVar48 * 0.0 + fVar65 * 0.0 + fVar68 * 1.0;
          fVar74 = fVar48 * 0.0 + fVar65 * 0.0 + fVar68 * 0.0;
          fVar48 = fVar69 * 1.0 + fVar57 * 0.0 + fVar66 * 0.0;
          fVar65 = fVar69 * 0.0 + fVar57 * 1.0 + fVar66 * 0.0;
          fVar55 = fVar69 * 0.0 + fVar57 * 0.0 + fVar66 * 1.0;
          fVar57 = fVar69 * 0.0 + fVar57 * 0.0 + fVar66 * 0.0;
          fVar76 = fVar54 * 1.0 + fVar56 * 0.0 + fVar63 * 0.0;
          fVar86 = fVar54 * 0.0 + fVar56 * 1.0 + fVar63 * 0.0;
          fVar87 = fVar54 * 0.0 + fVar56 * 0.0 + fVar63 * 1.0;
          fVar88 = fVar54 * 0.0 + fVar56 * 0.0 + fVar63 * 0.0;
          fVar66 = local_168 * fVar64 + fVar48 * 0.0 + fVar76 * 0.0;
          fVar68 = local_168 * fVar67 + fVar65 * 0.0 + fVar86 * 0.0;
          fVar72 = local_168 * fVar70 + fVar55 * 0.0 + fVar87 * 0.0;
          fVar101 = local_168 * fVar74 + fVar57 * 0.0 + fVar88 * 0.0;
          fVar69 = local_1a8 * fVar64 + fStack_1a4 * fVar48 + fVar76 * 0.0;
          fVar54 = local_1a8 * fVar67 + fStack_1a4 * fVar65 + fVar86 * 0.0;
          fVar56 = local_1a8 * fVar70 + fStack_1a4 * fVar55 + fVar87 * 0.0;
          fVar63 = local_1a8 * fVar74 + fStack_1a4 * fVar57 + fVar88 * 0.0;
          fVar98 = local_178 * fVar64 + fStack_174 * fVar48 + fStack_170 * fVar76;
          fVar100 = local_178 * fVar67 + fStack_174 * fVar65 + fStack_170 * fVar86;
          fVar97 = local_178 * fVar70 + fStack_174 * fVar55 + fStack_170 * fVar87;
          fVar99 = local_178 * fVar74 + fStack_174 * fVar57 + fStack_170 * fVar88;
          fVar48 = local_188 * fVar64 + fStack_184 * fVar48 + fStack_180 * fVar76 + fStack_164 + 0.0
          ;
          fVar65 = local_188 * fVar67 + fStack_184 * fVar65 + fStack_180 * fVar86 + fStack_160 + 0.0
          ;
          fVar55 = local_188 * fVar70 + fStack_184 * fVar55 + fStack_180 * fVar87 + fStack_1a0 + 0.0
          ;
          fVar57 = local_188 * fVar74 + fStack_184 * fVar57 + fStack_180 * fVar88 + 0.0;
          pAVar31 = InstanceArray::getObject(pIVar4,uVar34);
          auVar49 = minps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar39 = maxps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar74 = auVar49._0_4_;
          fVar86 = auVar49._4_4_;
          fVar64 = auVar49._8_4_;
          fVar76 = fVar64 * fVar98 + fVar48;
          fVar87 = fVar64 * fVar100 + fVar65;
          fVar88 = fVar64 * fVar97 + fVar55;
          fVar89 = fVar64 * fVar99 + fVar57;
          fVar91 = fVar86 * fVar69;
          fVar92 = fVar86 * fVar54;
          fVar93 = fVar86 * fVar56;
          fVar86 = fVar86 * fVar63;
          fVar77 = fVar91 + fVar76;
          fVar94 = fVar92 + fVar87;
          fVar95 = fVar93 + fVar88;
          fVar96 = fVar86 + fVar89;
          fVar71 = fVar74 * fVar66;
          fVar73 = fVar74 * fVar68;
          fVar75 = fVar74 * fVar72;
          fVar74 = fVar74 * fVar101;
          auVar84._0_4_ = fVar71 + fVar77;
          auVar84._4_4_ = fVar73 + fVar94;
          auVar84._8_4_ = fVar75 + fVar95;
          auVar84._12_4_ = fVar74 + fVar96;
          auVar49 = minps(_DAT_01f45a30,auVar84);
          auVar59 = maxps(_DAT_01f45a40,auVar84);
          fVar64 = auVar39._0_4_;
          fVar67 = auVar39._4_4_;
          fVar70 = auVar39._8_4_;
          fVar48 = fVar70 * fVar98 + fVar48;
          fVar65 = fVar70 * fVar100 + fVar65;
          fVar55 = fVar70 * fVar97 + fVar55;
          fVar57 = fVar70 * fVar99 + fVar57;
          fVar91 = fVar91 + fVar48;
          fVar92 = fVar92 + fVar65;
          fVar93 = fVar93 + fVar55;
          fVar86 = fVar86 + fVar57;
          auVar85._0_4_ = fVar71 + fVar91;
          auVar85._4_4_ = fVar73 + fVar92;
          auVar85._8_4_ = fVar75 + fVar93;
          auVar85._12_4_ = fVar74 + fVar86;
          auVar49 = minps(auVar49,auVar85);
          auVar59 = maxps(auVar59,auVar85);
          fVar69 = fVar67 * fVar69;
          fVar54 = fVar67 * fVar54;
          fVar56 = fVar67 * fVar56;
          fVar67 = fVar67 * fVar63;
          fVar76 = fVar76 + fVar69;
          fVar87 = fVar87 + fVar54;
          fVar88 = fVar88 + fVar56;
          fVar89 = fVar89 + fVar67;
          fVar63 = fVar71 + fVar76;
          fVar70 = fVar73 + fVar87;
          fVar98 = fVar75 + fVar88;
          fVar100 = fVar74 + fVar89;
          auVar28._4_4_ = fVar70;
          auVar28._0_4_ = fVar63;
          auVar28._8_4_ = fVar98;
          auVar28._12_4_ = fVar100;
          auVar49 = minps(auVar49,auVar28);
          auVar29._4_4_ = fVar70;
          auVar29._0_4_ = fVar63;
          auVar29._8_4_ = fVar98;
          auVar29._12_4_ = fVar100;
          auVar59 = maxps(auVar59,auVar29);
          fVar69 = fVar69 + fVar48;
          fVar54 = fVar54 + fVar65;
          fVar56 = fVar56 + fVar55;
          fVar67 = fVar67 + fVar57;
          fVar71 = fVar71 + fVar69;
          fVar73 = fVar73 + fVar54;
          fVar75 = fVar75 + fVar56;
          fVar74 = fVar74 + fVar67;
          auVar39._4_4_ = fVar73;
          auVar39._0_4_ = fVar71;
          auVar39._8_4_ = fVar75;
          auVar39._12_4_ = fVar74;
          auVar49 = minps(auVar49,auVar39);
          auVar13._4_4_ = fVar73;
          auVar13._0_4_ = fVar71;
          auVar13._8_4_ = fVar75;
          auVar13._12_4_ = fVar74;
          auVar59 = maxps(auVar59,auVar13);
          fVar66 = fVar64 * fVar66;
          fVar68 = fVar64 * fVar68;
          fVar72 = fVar64 * fVar72;
          fVar64 = fVar64 * fVar101;
          fVar77 = fVar77 + fVar66;
          fVar94 = fVar94 + fVar68;
          fVar95 = fVar95 + fVar72;
          fVar96 = fVar96 + fVar64;
          auVar20._4_4_ = fVar94;
          auVar20._0_4_ = fVar77;
          auVar20._8_4_ = fVar95;
          auVar20._12_4_ = fVar96;
          auVar49 = minps(auVar49,auVar20);
          auVar21._4_4_ = fVar94;
          auVar21._0_4_ = fVar77;
          auVar21._8_4_ = fVar95;
          auVar21._12_4_ = fVar96;
          auVar59 = maxps(auVar59,auVar21);
          auVar62._0_4_ = fVar91 + fVar66;
          auVar62._4_4_ = fVar92 + fVar68;
          auVar62._8_4_ = fVar93 + fVar72;
          auVar62._12_4_ = fVar86 + fVar64;
          auVar49 = minps(auVar49,auVar62);
          auVar59 = maxps(auVar59,auVar62);
          auVar53._0_4_ = fVar76 + fVar66;
          auVar53._4_4_ = fVar87 + fVar68;
          auVar53._8_4_ = fVar88 + fVar72;
          auVar53._12_4_ = fVar89 + fVar64;
          auVar49 = minps(auVar49,auVar53);
          auVar39 = maxps(auVar59,auVar53);
          auVar44._0_4_ = fVar66 + fVar69;
          auVar44._4_4_ = fVar68 + fVar54;
          auVar44._8_4_ = fVar72 + fVar56;
          auVar44._12_4_ = fVar64 + fVar67;
          auVar59 = minps(auVar49,auVar44);
          auVar49 = maxps(auVar39,auVar44);
        }
        else {
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM10_Db = *(float *)(pcVar6 + lVar33 + 0x10);
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 4);
            in_XMM12_Da = *(float *)(pcVar6 + lVar33 + 8);
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM10_Dc = *(float *)(pcVar6 + lVar33 + 0x20);
            in_XMM10_Dd = 0.0;
            in_XMM11_Db = *(float *)(pcVar6 + lVar33 + 0x14);
            in_XMM11_Dc = *(float *)(pcVar6 + lVar33 + 0x24);
            in_XMM11_Dd = 0.0;
            in_XMM12_Db = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM12_Dc = *(float *)(pcVar6 + lVar33 + 0x28);
            in_XMM12_Dd = 0.0;
            in_XMM13_Db = *(float *)(pcVar6 + lVar33 + 0x1c);
            in_XMM13_Dc = *(float *)(pcVar6 + lVar33 + 0x2c);
            in_XMM13_Dd = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 4);
            in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 4) >> 0x20);
            in_XMM10_Dd = 0.0;
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            in_XMM11_Dd = 0.0;
            in_XMM12_Da = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM12_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            in_XMM12_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            in_XMM12_Dd = 0.0;
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0x24);
            in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x28);
            in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x28) >> 0x20);
            in_XMM13_Dd = 0.0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            in_XMM12_Da = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x10);
            in_XMM12_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x10) >> 0x20);
            in_XMM10_Da = *(float *)(pcVar6 + lVar33);
            in_XMM11_Db = *(float *)(pcVar6 + lVar33 + 4);
            in_XMM12_Dc = *(float *)(pcVar6 + lVar33 + 8);
            in_XMM11_Da = *(float *)(pcVar6 + lVar33 + 0xc);
            in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x34);
            in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x34) >> 0x20);
            in_XMM13_Da = *(float *)(pcVar6 + lVar33 + 0x18);
            in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar33 + 0x1c);
            in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar33 + 0x1c) >> 0x20);
            fVar69 = *(float *)(pcVar6 + lVar33 + 0x24);
            fVar48 = *(float *)(pcVar6 + lVar33 + 0x28);
            fVar65 = *(float *)(pcVar6 + lVar33 + 0x2c);
            fVar54 = *(float *)(pcVar6 + lVar33 + 0x30);
            fVar56 = fVar54 * fVar54 + fVar65 * fVar65 + fVar69 * fVar69 + fVar48 * fVar48;
            auVar49 = rsqrtss(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
            fVar55 = auVar49._0_4_;
            fVar55 = fVar55 * fVar55 * fVar56 * -0.5 * fVar55 + fVar55 * 1.5;
            in_XMM13_Dd = fVar69 * fVar55;
            in_XMM10_Dd = fVar48 * fVar55;
            in_XMM11_Dd = fVar65 * fVar55;
            in_XMM12_Dd = fVar55 * fVar54;
            in_XMM11_Dc = *(float *)(pcVar6 + lVar33 + 0x3c);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar5->ptr_ofs;
            lVar33 = pRVar5->stride * uVar34;
            pfVar1 = (float *)(pcVar6 + lVar33);
            in_XMM10_Da = *pfVar1;
            in_XMM10_Db = pfVar1[1];
            in_XMM10_Dc = pfVar1[2];
            in_XMM10_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x10);
            in_XMM11_Da = *pfVar1;
            in_XMM11_Db = pfVar1[1];
            in_XMM11_Dc = pfVar1[2];
            in_XMM11_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x20);
            in_XMM12_Da = *pfVar1;
            in_XMM12_Db = pfVar1[1];
            in_XMM12_Dc = pfVar1[2];
            in_XMM12_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar6 + lVar33 + 0x30);
            in_XMM13_Da = *pfVar1;
            in_XMM13_Db = pfVar1[1];
            in_XMM13_Dc = pfVar1[2];
            in_XMM13_Dd = pfVar1[3];
          }
          pAVar31 = InstanceArray::getObject(pIVar4,uVar34);
          auVar49 = minps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar39 = maxps((undefined1  [16])(pAVar31->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar31->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar54 = auVar49._0_4_;
          fVar56 = auVar49._4_4_;
          fVar69 = auVar49._8_4_;
          fVar55 = fVar69 * in_XMM12_Da + in_XMM13_Da;
          fVar57 = fVar69 * in_XMM12_Db + in_XMM13_Db;
          fVar63 = fVar69 * in_XMM12_Dc + in_XMM13_Dc;
          fVar64 = fVar69 * in_XMM12_Dd + in_XMM13_Dd;
          fVar76 = fVar56 * in_XMM11_Da + fVar55;
          fVar86 = fVar56 * in_XMM11_Db + fVar57;
          fVar87 = fVar56 * in_XMM11_Dc + fVar63;
          fVar88 = fVar56 * in_XMM11_Dd + fVar64;
          fVar70 = fVar54 * in_XMM10_Da;
          fVar72 = fVar54 * in_XMM10_Db;
          fVar74 = fVar54 * in_XMM10_Dc;
          fVar54 = fVar54 * in_XMM10_Dd;
          auVar82._0_4_ = fVar70 + fVar76;
          auVar82._4_4_ = fVar72 + fVar86;
          auVar82._8_4_ = fVar74 + fVar87;
          auVar82._12_4_ = fVar54 + fVar88;
          auVar49 = minps(_DAT_01f45a30,auVar82);
          auVar59 = maxps(_DAT_01f45a40,auVar82);
          fVar69 = auVar39._0_4_;
          fVar48 = auVar39._4_4_;
          fVar65 = auVar39._8_4_;
          fVar89 = fVar65 * in_XMM12_Da + in_XMM13_Da;
          fVar91 = fVar65 * in_XMM12_Db + in_XMM13_Db;
          fVar92 = fVar65 * in_XMM12_Dc + in_XMM13_Dc;
          fVar93 = fVar65 * in_XMM12_Dd + in_XMM13_Dd;
          fVar66 = fVar56 * in_XMM11_Da + fVar89;
          fVar67 = fVar56 * in_XMM11_Db + fVar91;
          fVar68 = fVar56 * in_XMM11_Dc + fVar92;
          fVar56 = fVar56 * in_XMM11_Dd + fVar93;
          auVar83._0_4_ = fVar70 + fVar66;
          auVar83._4_4_ = fVar72 + fVar67;
          auVar83._8_4_ = fVar74 + fVar68;
          auVar83._12_4_ = fVar54 + fVar56;
          auVar49 = minps(auVar49,auVar83);
          auVar59 = maxps(auVar59,auVar83);
          fVar55 = fVar55 + fVar48 * in_XMM11_Da;
          fVar57 = fVar57 + fVar48 * in_XMM11_Db;
          fVar63 = fVar63 + fVar48 * in_XMM11_Dc;
          fVar64 = fVar64 + fVar48 * in_XMM11_Dd;
          fVar65 = fVar70 + fVar55;
          fVar71 = fVar72 + fVar57;
          fVar73 = fVar74 + fVar63;
          fVar75 = fVar54 + fVar64;
          auVar26._4_4_ = fVar71;
          auVar26._0_4_ = fVar65;
          auVar26._8_4_ = fVar73;
          auVar26._12_4_ = fVar75;
          auVar49 = minps(auVar49,auVar26);
          auVar27._4_4_ = fVar71;
          auVar27._0_4_ = fVar65;
          auVar27._8_4_ = fVar73;
          auVar27._12_4_ = fVar75;
          auVar59 = maxps(auVar59,auVar27);
          fVar89 = fVar48 * in_XMM11_Da + fVar89;
          fVar91 = fVar48 * in_XMM11_Db + fVar91;
          fVar92 = fVar48 * in_XMM11_Dc + fVar92;
          fVar93 = fVar48 * in_XMM11_Dd + fVar93;
          fVar70 = fVar70 + fVar89;
          fVar72 = fVar72 + fVar91;
          fVar74 = fVar74 + fVar92;
          fVar54 = fVar54 + fVar93;
          auVar11._4_4_ = fVar72;
          auVar11._0_4_ = fVar70;
          auVar11._8_4_ = fVar74;
          auVar11._12_4_ = fVar54;
          auVar49 = minps(auVar49,auVar11);
          auVar12._4_4_ = fVar72;
          auVar12._0_4_ = fVar70;
          auVar12._8_4_ = fVar74;
          auVar12._12_4_ = fVar54;
          auVar59 = maxps(auVar59,auVar12);
          fVar48 = fVar69 * in_XMM10_Da;
          fVar65 = fVar69 * in_XMM10_Db;
          fVar54 = fVar69 * in_XMM10_Dc;
          fVar69 = fVar69 * in_XMM10_Dd;
          fVar76 = fVar76 + fVar48;
          fVar86 = fVar86 + fVar65;
          fVar87 = fVar87 + fVar54;
          fVar88 = fVar88 + fVar69;
          auVar18._4_4_ = fVar86;
          auVar18._0_4_ = fVar76;
          auVar18._8_4_ = fVar87;
          auVar18._12_4_ = fVar88;
          auVar49 = minps(auVar49,auVar18);
          auVar19._4_4_ = fVar86;
          auVar19._0_4_ = fVar76;
          auVar19._8_4_ = fVar87;
          auVar19._12_4_ = fVar88;
          auVar59 = maxps(auVar59,auVar19);
          auVar61._0_4_ = fVar66 + fVar48;
          auVar61._4_4_ = fVar67 + fVar65;
          auVar61._8_4_ = fVar68 + fVar54;
          auVar61._12_4_ = fVar56 + fVar69;
          auVar49 = minps(auVar49,auVar61);
          auVar59 = maxps(auVar59,auVar61);
          auVar52._0_4_ = fVar55 + fVar48;
          auVar52._4_4_ = fVar57 + fVar65;
          auVar52._8_4_ = fVar63 + fVar54;
          auVar52._12_4_ = fVar64 + fVar69;
          auVar49 = minps(auVar49,auVar52);
          auVar39 = maxps(auVar59,auVar52);
          auVar43._0_4_ = fVar48 + fVar89;
          auVar43._4_4_ = fVar65 + fVar91;
          auVar43._8_4_ = fVar54 + fVar92;
          auVar43._12_4_ = fVar69 + fVar93;
          auVar59 = minps(auVar49,auVar43);
          auVar49 = maxps(auVar39,auVar43);
        }
      }
      uVar38 = (uint)(((auVar49._0_4_ + auVar59._0_4_) - (float)local_1b8._0_4_) *
                     (float)((uint)(((1.0 - auVar36._0_4_ * fVar47) * fVar47 + fVar47) * 1013.76) &
                            -(uint)(1e-19 < auVar36._0_4_)));
      uVar45 = (uint)(((auVar49._4_4_ + auVar59._4_4_) - (float)local_1b8._4_4_) *
                     (float)((uint)(((1.0 - auVar36._4_4_ * fVar37) * fVar37 + fVar37) * 1013.76) &
                            -(uint)(1e-19 < auVar36._4_4_)));
      uVar46 = (uint)(((auVar49._8_4_ + auVar59._8_4_) - fStack_1b0) *
                     (float)((uint)(((1.0 - auVar36._8_4_ * fVar90) * fVar90 + fVar90) * 1013.76) &
                            -(uint)(1e-19 < auVar36._8_4_)));
      this->morton[uVar35].field_0.field_0.code =
           ((((uVar46 << 0x10 | uVar46) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 0x14
           & 0x24924924 |
           ((((uVar45 << 0x10 | uVar45) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492 |
           ((((uVar38 << 0x10 | uVar38) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5 &
           0x9249249;
      uVar45 = current->_end;
    }
    std::__sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + uVar45);
    return;
  }
  mapping.base.field_0._0_8_ = 0x7f8000007f800000;
  mapping.base.field_0._8_8_ = 0x7f8000007f800000;
  mapping.scale.field_0._0_8_ = 0xff800000ff800000;
  mapping.scale.field_0._8_8_ = 0xff800000ff800000;
  calculateCentBounds.this =
       (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
        *)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_108.my_begin = uVar38;
  local_108.my_end = uVar45;
  local_108.my_grainsize = 0x400;
  local_128._0_8_ = BBox<embree::Vec3fa>::merge;
  local_128._8_8_ = &calculateCentBounds;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstanceArrayPrimitive>,embree::sse2::CalculateMeshBounds<embree::InstanceArray>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstanceArrayPrimitive>,embree::sse2::CalculateMeshBounds<embree::InstanceArray>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
            (&centBounds,(d1 *)&local_108,(blocked_range<unsigned_int> *)&mapping,
             (BBox<embree::Vec3fa> *)local_128,
             (anon_class_16_2_ed117de8_conflict24 *)BBox<embree::Vec3fa>::merge,
             (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
             &context,in_stack_fffffffffffffde8);
  cVar30 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar30 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    auVar49._0_4_ = centBounds.upper.field_0.m128[0] - centBounds.lower.field_0.m128[0];
    auVar49._4_4_ = centBounds.upper.field_0.m128[1] - centBounds.lower.field_0.m128[1];
    auVar49._8_4_ = centBounds.upper.field_0.m128[2] - centBounds.lower.field_0.m128[2];
    auVar49._12_4_ = centBounds.upper.field_0.m128[3] - centBounds.lower.field_0.m128[3];
    auVar59 = rcpps(in_XMM2,auVar49);
    fVar47 = auVar59._0_4_;
    fVar37 = auVar59._4_4_;
    fVar90 = auVar59._8_4_;
    fVar69 = auVar59._12_4_;
    mapping.scale.field_0.i[1] =
         (uint)(((1.0 - auVar49._4_4_ * fVar37) * fVar37 + fVar37) * 1013.76) &
         -(uint)(1e-19 < auVar49._4_4_);
    mapping.scale.field_0.i[0] =
         (uint)(((1.0 - auVar49._0_4_ * fVar47) * fVar47 + fVar47) * 1013.76) &
         -(uint)(1e-19 < auVar49._0_4_);
    mapping.scale.field_0.i[3] =
         (uint)(((1.0 - auVar49._12_4_ * fVar69) * fVar69 + fVar69) * 1013.76) &
         -(uint)(1e-19 < auVar49._12_4_);
    mapping.scale.field_0.i[2] =
         (uint)(((1.0 - auVar49._8_4_ * fVar90) * fVar90 + fVar90) * 1013.76) &
         -(uint)(1e-19 < auVar49._8_4_);
    rVar2 = *current;
    local_128._0_8_ = this;
    local_128._8_8_ = &mapping;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_1b8._0_4_ = rVar2._begin;
    local_1b8._4_4_ = rVar2._end;
    local_108.my_begin = local_1b8._0_4_;
    local_108.my_end = local_1b8._4_4_;
    local_108.my_grainsize = 0x400;
    local_110.func = (anon_class_16_2_00173b7b *)local_128;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstanceArrayPrimitive>,embree::sse2::CalculateMeshBounds<embree::InstanceArray>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstanceArrayPrimitive>,embree::sse2::CalculateMeshBounds<embree::InstanceArray>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_108,&local_110,&context);
    cVar30 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar30 == '\0') {
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      tbb::detail::d1::parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*>
                (this->morton + current->_begin,this->morton + current->_end);
      return;
    }
    prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar32,"task cancelled");
    __cxa_throw(prVar32,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar32,"task cancelled");
  __cxa_throw(prVar32,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }